

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Company *company)

{
  int iVar1;
  ostream *poVar2;
  void *this;
  int local_1c;
  int i;
  Company *company_local;
  ostream *os_local;
  
  poVar2 = std::operator<<(os,"budget: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,company->budget);
  poVar2 = std::operator<<(poVar2," boss: ");
  this = (void *)std::ostream::operator<<(poVar2,company->boss);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  local_1c = 0;
  while( true ) {
    iVar1 = Boss::getNumberOfEmployee(company->boss);
    if (iVar1 <= local_1c) break;
    poVar2 = std::operator<<(os," employee: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,company->employee[local_1c]);
    std::operator<<(poVar2,"\t");
    local_1c = local_1c + 1;
  }
  return os;
}

Assistant:

ostream &operator<<(ostream &os, const Company &company) {
    os << "budget: " << company.budget << " boss: " << company.boss << endl;
    for (int i = 0; i < company.boss->getNumberOfEmployee(); ++i) {
        os << " employee: " << company.employee[i] << "\t";
    }
    return os;
}